

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void action_bribe(tgestate_t *state)

{
  byte bVar1;
  uint8_t character;
  uint8_t iters;
  vischar_t *vischar;
  tgestate_t *state_local;
  
  vischar = state->vischars;
  iters = '\a';
  while( true ) {
    vischar = vischar + 1;
    bVar1 = vischar->character;
    if ((bVar1 != 0xff) && (0x13 < bVar1)) break;
    iters = iters + 0xff;
    if (iters == '\0') {
      return;
    }
  }
  state->bribed_character = bVar1;
  vischar->flags = '\x01';
  return;
}

Assistant:

void action_bribe(tgestate_t *state)
{
  vischar_t *vischar;   /* was HL */
  uint8_t    iters;     /* was B */
  uint8_t    character; /* was A */

  assert(state != NULL);

  /* Walk non-player visible characters. */
  vischar = &state->vischars[1];
  iters = vischars_LENGTH - 1;
  do
  {
    character = vischar->character;
    if (character != character_NONE && character >= character_20_PRISONER_1)
      goto found;
    vischar++;
  }
  while (--iters);

  return;

found:
  state->bribed_character = character;
  vischar->flags = vischar_PURSUIT_PURSUE; /* Bribed character pursues hero. */
}